

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

int SUNMatScaleAdd_Band(realtype c,SUNMatrix A,SUNMatrix B)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  SUNMatrix A_00;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar4 = SMCompatible_Band(A,B);
  if (iVar4 == 0) {
    iVar4 = 1;
  }
  else {
    pvVar1 = B->content;
    lVar7 = *(long *)((long)pvVar1 + 0x18);
    pvVar2 = A->content;
    lVar6 = *(long *)((long)pvVar2 + 0x18);
    if (lVar6 < lVar7) {
      lVar10 = *(long *)((long)pvVar2 + 0x20);
      lVar5 = *(long *)((long)pvVar1 + 0x20);
    }
    else {
      lVar5 = *(long *)((long)pvVar1 + 0x20);
      lVar10 = *(long *)((long)pvVar2 + 0x20);
      if (lVar5 <= lVar10) {
        lVar6 = *(long *)((long)pvVar2 + 8);
        if (*(long *)((long)pvVar2 + 8) < 1) {
          lVar6 = 0;
        }
        for (lVar10 = 0; lVar10 != lVar6; lVar10 = lVar10 + 1) {
          lVar9 = *(long *)((long)pvVar2 + 0x28) * 8 +
                  *(long *)(*(long *)((long)pvVar2 + 0x40) + lVar10 * 8);
          lVar3 = *(long *)((long)pvVar1 + 0x28);
          lVar11 = *(long *)(*(long *)((long)pvVar1 + 0x40) + lVar10 * 8);
          for (lVar8 = -lVar7; lVar8 <= lVar5; lVar8 = lVar8 + 1) {
            *(double *)(lVar9 + lVar8 * 8) =
                 *(double *)(lVar9 + lVar8 * 8) * c + *(double *)(lVar3 * 8 + lVar11 + lVar8 * 8);
          }
        }
        return 0;
      }
    }
    if (lVar5 < lVar10) {
      lVar5 = lVar10;
    }
    if (lVar7 < lVar6) {
      lVar7 = lVar6;
    }
    lVar6 = *(long *)((long)pvVar2 + 8);
    lVar10 = lVar6 + -1;
    if (lVar5 + lVar7 < lVar6) {
      lVar10 = lVar5 + lVar7;
    }
    A_00 = SUNBandMatrixStorage(lVar6,lVar7,lVar5,lVar10);
    pvVar1 = A->content;
    lVar6 = 0;
    lVar7 = *(long *)((long)pvVar1 + 8);
    if (*(long *)((long)pvVar1 + 8) < 1) {
      lVar7 = lVar6;
    }
    for (; lVar6 != lVar7; lVar6 = lVar6 + 1) {
      lVar10 = *(long *)((long)pvVar1 + 0x28);
      lVar5 = *(long *)(*(long *)((long)pvVar1 + 0x40) + lVar6 * 8);
      lVar3 = *(long *)((long)A_00->content + 0x28);
      lVar11 = *(long *)(*(long *)((long)A_00->content + 0x40) + lVar6 * 8);
      lVar8 = *(long *)((long)pvVar1 + 0x20);
      for (lVar9 = -*(long *)((long)pvVar1 + 0x18); lVar9 <= lVar8; lVar9 = lVar9 + 1) {
        *(double *)(lVar3 * 8 + lVar11 + lVar9 * 8) =
             *(double *)(lVar10 * 8 + lVar5 + lVar9 * 8) * c;
      }
    }
    pvVar2 = B->content;
    lVar6 = 0;
    lVar7 = *(long *)((long)pvVar2 + 8);
    if (*(long *)((long)pvVar2 + 8) < 1) {
      lVar7 = lVar6;
    }
    for (; lVar6 != lVar7; lVar6 = lVar6 + 1) {
      lVar10 = *(long *)((long)pvVar2 + 0x28);
      lVar5 = *(long *)(*(long *)((long)pvVar2 + 0x40) + lVar6 * 8);
      lVar8 = *(long *)((long)A_00->content + 0x28) * 8 +
              *(long *)(*(long *)((long)A_00->content + 0x40) + lVar6 * 8);
      lVar3 = *(long *)((long)pvVar2 + 0x20);
      for (lVar11 = -*(long *)((long)pvVar2 + 0x18); lVar11 <= lVar3; lVar11 = lVar11 + 1) {
        *(double *)(lVar8 + lVar11 * 8) =
             *(double *)(lVar10 * 8 + lVar5 + lVar11 * 8) + *(double *)(lVar8 + lVar11 * 8);
      }
    }
    free(*(void **)((long)pvVar1 + 0x30));
    pvVar1 = A->content;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    free(*(void **)((long)pvVar1 + 0x40));
    free(A->content);
    A->content = A_00->content;
    A_00->content = (void *)0x0;
    SUNMatDestroy_Band(A_00);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int SUNMatScaleAdd_Band(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j;
  realtype *A_colj, *B_colj;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Band(A, B))
    return 1;

  /* Call separate routine in B has larger bandwidth(s) than A */
  if ( (SM_UBAND_B(B) > SM_UBAND_B(A)) ||
       (SM_LBAND_B(B) > SM_LBAND_B(A)) ) {
    return SMScaleAddNew_Band(c,A,B);
  }
  
  /* Otherwise, perform operation in-place */
  for (j=0; j<SM_COLUMNS_B(A); j++) {
    A_colj = SM_COLUMN_B(A,j);
    B_colj = SM_COLUMN_B(B,j);
    for (i=-SM_UBAND_B(B); i<=SM_LBAND_B(B); i++)
      A_colj[i] = c*A_colj[i] + B_colj[i];
  }
  return 0;
}